

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_drawing.h
# Opt level: O0

void dlib::fill_rect<dlib::rgb_pixel>(canvas *c,rectangle *rect,rgb_pixel *pixel)

{
  long *plVar1;
  long lVar2;
  canvas *in_RDI;
  long x;
  long y;
  rectangle area;
  rgb_pixel *src;
  canvas *this;
  rectangle *in_stack_ffffffffffffffb8;
  long lVar3;
  rectangle *in_stack_ffffffffffffffc0;
  rgb_pixel *prVar4;
  rectangle local_38;
  canvas *local_8;
  
  local_8 = in_RDI;
  rectangle::intersect(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  plVar1 = rectangle::top(&local_38);
  prVar4 = (rgb_pixel *)*plVar1;
  while( true ) {
    src = prVar4;
    plVar1 = rectangle::bottom(&local_38);
    if (*plVar1 < (long)prVar4) break;
    plVar1 = rectangle::left(&local_38);
    lVar2 = *plVar1;
    while( true ) {
      lVar3 = lVar2;
      plVar1 = rectangle::right(&local_38);
      if (*plVar1 < lVar2) break;
      this = local_8;
      prVar4 = src;
      lVar2 = rectangle::top(&local_8->super_rectangle);
      canvas::operator[](this,(long)src - lVar2);
      rectangle::left(&local_8->super_rectangle);
      assign_pixel<dlib::canvas::pixel,dlib::rgb_pixel>((pixel *)this,src);
      lVar2 = lVar3 + 1;
      src = prVar4;
    }
    prVar4 = (rgb_pixel *)&src->green;
  }
  return;
}

Assistant:

void fill_rect (
        const canvas& c,
        const rectangle& rect,
        const pixel_type& pixel
    )
    {
        rectangle area = rect.intersect(c);
        for (long y = area.top(); y <= area.bottom(); ++y)
        {
            for (long x = area.left(); x <= area.right(); ++x)
            {
                assign_pixel(c[y-c.top()][x-c.left()], pixel);
            }
        }
    }